

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffflsh(fitsfile *fptr,int clearbuf,int *status)

{
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_stack_00000008;
  int ii;
  undefined4 in_stack_00000018;
  FITSfile *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 0x28; local_1c = local_1c + 1) {
    if ((-1 < *(long *)(*(long *)(in_RDI + 8) + 0x568 + (long)local_1c * 8)) &&
       (*(int *)(*(long *)(in_RDI + 8) + 0x6a8 + (long)local_1c * 4) != 0)) {
      ffbfwt((FITSfile *)CONCAT44(clearbuf,in_stack_00000018),status._4_4_,in_stack_00000008);
    }
    if (in_ESI != 0) {
      *(undefined8 *)(*(long *)(in_RDI + 8) + 0x568 + (long)local_1c * 8) = 0xffffffffffffffff;
    }
  }
  if (*in_RDX != 0x70) {
    ffflushx(in_stack_ffffffffffffffd8);
  }
  return *in_RDX;
}

Assistant:

int ffflsh(fitsfile *fptr,        /* I - FITS file pointer           */
           int clearbuf,          /* I - also clear buffer contents? */
           int *status)           /* IO - error status               */
{
/*
  flush all dirty IO buffers associated with the file to disk
*/
    int ii;

/*
   no need to move to a different HDU

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
*/
    for (ii = 0; ii < NIOBUF; ii++)
    {
	/* flush modified buffer to disk */
        if ((fptr->Fptr)->bufrecnum[ii] >= 0 &&(fptr->Fptr)->dirty[ii])
           ffbfwt(fptr->Fptr, ii, status);

        if (clearbuf)
          (fptr->Fptr)->bufrecnum[ii] = -1;  /* set contents of buffer as undefined */
    }

    if (*status != READONLY_FILE)
      ffflushx(fptr->Fptr);  /* flush system buffers to disk */

    return(*status);
}